

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O2

void sincosd(double angle,double *s,double *c)

{
  uint uVar1;
  uint uVar2;
  undefined *puVar3;
  double dVar4;
  
  dVar4 = fmod(angle,90.0);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar4 = sin(angle * 0.017453292519943295);
    *s = dVar4;
    dVar4 = cos(angle * 0.017453292519943295);
    goto LAB_00117874;
  }
  dVar4 = floor(angle / 90.0 + 0.5);
  uVar1 = (uint)dVar4;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  switch(uVar2 & 3) {
  case 0:
    *s = 0.0;
    dVar4 = 1.0;
    goto LAB_00117874;
  case 1:
    puVar3 = &DAT_00209930;
    break;
  case 2:
    *s = 0.0;
    dVar4 = -1.0;
    goto LAB_00117874;
  case 3:
    puVar3 = &DAT_00209920;
  }
  dVar4 = 0.0;
  *s = *(double *)(puVar3 + (ulong)(0.0 < angle) * 8);
LAB_00117874:
  *c = dVar4;
  return;
}

Assistant:

void sincosd(double angle, double *s, double *c) {
    int i;

    if (fmod(angle, 90.0) == 0.0) {
        i = abs((int) floor(angle / 90.0 + 0.5)) % 4;
        switch (i) {
        case 0:
            *s = 0.0;
            *c = 1.0;
            return;
        case 1:
            *s = (angle > 0.0) ? 1.0 : -1.0;
            *c = 0.0;
            return;
        case 2:
            *s = 0.0;
            *c = -1.0;
            return;
        case 3:
            *s = (angle > 0.0) ? -1.0 : 1.0;
            *c = 0.0;
            return;
        }
    }

    angle *= D2R;
    *s = sin(angle);
    *c = cos(angle);
}